

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O0

bool __thiscall
crnlib::command_line_params::get_value_as_bool
          (command_line_params *this,char *pKey,uint index,bool def)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_38;
  _Self local_30;
  param_map_const_iterator it;
  bool def_local;
  uint index_local;
  char *pKey_local;
  command_line_params *this_local;
  
  it._M_node._3_1_ = def;
  it._M_node._4_4_ = index;
  local_30._M_node = (_Base_ptr)get_param(this,pKey,index);
  local_38._M_node = (_Base_ptr)end(this);
  bVar1 = std::operator==(&local_30,&local_38);
  if (bVar1) {
    this_local._7_1_ = (bool)(it._M_node._3_1_ & 1);
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
             ::operator->(&local_30);
    if ((ppVar2->second).m_modifier == '\0') {
      this_local._7_1_ = true;
    }
    else {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
               ::operator->(&local_30);
      this_local._7_1_ = '\0' < (ppVar2->second).m_modifier;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool command_line_params::get_value_as_bool(const char* pKey, uint index, bool def) const {
  param_map_const_iterator it = get_param(pKey, index);
  if (it == end())
    return def;

  if (it->second.m_modifier)
    return it->second.m_modifier > 0;
  else
    return true;
}